

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

QArrayDataPointer<QLayoutStruct> * __thiscall
QArrayDataPointer<QLayoutStruct>::operator=
          (QArrayDataPointer<QLayoutStruct> *this,QArrayDataPointer<QLayoutStruct> *other)

{
  QArrayDataPointer<QLayoutStruct> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QLayoutStruct> tmp;
  QArrayDataPointer<QLayoutStruct> *this_00;
  QArrayDataPointer<QLayoutStruct> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.ptr = (QLayoutStruct *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = &local_28;
  QArrayDataPointer(this_00,in_RDI);
  swap(this_00,in_RDI);
  ~QArrayDataPointer(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QArrayDataPointer &operator=(const QArrayDataPointer &other) noexcept
    {
        QArrayDataPointer tmp(other);
        this->swap(tmp);
        return *this;
    }